

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  pointer pVVar3;
  pointer pVVar4;
  Variable<tcu::Vector<float,_2>_> *pVVar5;
  pointer pcVar6;
  PrecisionCase *pPVar7;
  undefined8 uVar8;
  bool bVar9;
  ContextType type;
  int iVar10;
  _Base_ptr p_Var11;
  char *pcVar12;
  size_t sVar13;
  long *plVar14;
  ShaderExecutor *pSVar15;
  long lVar16;
  IVal *pIVar17;
  TestError *this_00;
  uint uVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar20;
  IVal reference0;
  FuncSet funcs;
  IVal reference1;
  ostringstream os;
  IVal in3;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_508 [8];
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_500;
  pointer local_4f8;
  undefined1 local_4f0 [32];
  undefined1 auStack_4d0 [8];
  undefined8 uStack_4c8;
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  local_4c0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_490;
  FloatFormat *local_488;
  IVal local_479;
  PrecisionCase *local_478;
  size_t local_470;
  Statement *local_468;
  IVal *local_460;
  undefined1 local_458 [8];
  pointer pVStack_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  double local_438;
  Data DStack_430;
  undefined4 local_420;
  ios_base local_3e8 [8];
  ios_base local_3e0 [264];
  string local_2d8;
  pointer local_2b8;
  ResultCollector *local_2b0;
  FloatFormat local_2a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_280;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [32];
  double local_188;
  double dStack_180;
  ios_base local_138 [264];
  
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_470 = (long)pVVar4 - (long)pVVar3 >> 3;
  local_500 = variables;
  local_490 = inputs;
  local_468 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_250,local_470);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2a8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2a8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2a8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2a8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2a8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2a8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2a8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2a8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2a8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_280._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_280._M_impl.super__Rb_tree_header._M_header;
  local_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_280._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_458 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_280._M_impl.super__Rb_tree_header._M_header._M_right =
       local_280._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_450);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,"Statement: ",0xb);
  (*local_468->_vptr_Statement[2])(local_468,(ostringstream *)&pVStack_450);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_450);
  std::ios_base::~ios_base(local_3e0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = &local_4c0._M_impl.super__Rb_tree_header;
  local_4c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4f8 = pVVar3;
  local_4c0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_4c0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (*local_468->_vptr_Statement[4])(local_468,&local_4c0);
  if ((_Rb_tree_header *)local_4c0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var11 = local_4c0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      (**(code **)(**(long **)(p_Var11 + 1) + 0x30))(*(long **)(p_Var11 + 1),local_1a8);
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var1);
  }
  if (local_4c0._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_458 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_450,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_450,(char *)local_4f0._0_8_,local_4f0._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_4f0._0_8_ != (long)local_4f0 + 0x10) {
      operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_450);
    std::ios_base::~ios_base(local_3e0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree(&local_4c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"precision ",10);
  pcVar12 = glu::getPrecisionName((this->m_ctx).precision);
  if (pcVar12 == (char *)0x0) {
    std::ios::clear((int)(auStack_508 + *(long *)((long)local_458 + -0x18)) + 0xb0);
  }
  else {
    sVar13 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,pcVar12,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar6 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
  std::ios_base::~ios_base(local_3e8);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar20 = local_500;
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&this->m_extension);
    plVar14 = (long *)std::__cxx11::string::append(local_1a8);
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar19) {
      local_448._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_448._8_8_ = plVar14[3];
      local_458 = (undefined1  [8])&local_448;
    }
    else {
      local_448._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_458 = (undefined1  [8])*plVar14;
    }
    pVStack_450 = (pointer)plVar14[1];
    *plVar14 = (long)paVar19;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_458);
    if (local_458 != (undefined1  [8])&local_448) {
      operator_delete((void *)local_458,local_448._M_allocated_capacity + 1);
    }
    pVVar20 = local_500;
    if ((pointer)local_1a8._0_8_ != pcVar6) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),3);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_458,this,
             (pVVar20->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar8 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x70),(string *)local_458);
  glu::VarType::operator=(&((pointer)(uVar8 + 0x70))->varType,(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  pVVar20 = local_500;
  if (local_458 != (undefined1  [8])&local_448) {
    operator_delete((void *)local_458,local_448._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_458,this,
             (pVVar20->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar8 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_458);
  glu::VarType::operator=(&((pointer)(uVar8 + 0x38))->varType,(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  pVVar20 = local_500;
  if (local_458 != (undefined1  [8])&local_448) {
    operator_delete((void *)local_458,local_448._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_458,this,
             (pVVar20->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar8 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_458);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if (local_458 != (undefined1  [8])&local_448) {
    operator_delete((void *)local_458,local_448._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),1);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_458,this,
             (local_500->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar8 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_458);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if (local_458 != (undefined1  [8])&local_448) {
    operator_delete((void *)local_458,local_448._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
  (*local_468->_vptr_Statement[2])(local_468,local_458);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
  std::ios_base::~ios_base(local_3e8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  pSVar15 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_220)
  ;
  local_458 = (undefined1  [8])
              (local_490->in0).
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pVStack_450 = (pointer)(local_490->in1).
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
  local_448._M_allocated_capacity =
       (size_type)
       (local_490->in2).
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_448._8_8_ =
       (local_490->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar15->_vptr_ShaderExecutor[3])
            (pSVar15,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar10 = (*pSVar15->_vptr_ShaderExecutor[2])(pSVar15);
  if ((char)iVar10 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar15->_vptr_ShaderExecutor[5])(pSVar15);
  (*pSVar15->_vptr_ShaderExecutor[6])(pSVar15,local_470,local_458,local_1a8);
  local_488 = &(this->m_ctx).floatFormat;
  local_478 = this;
  (*pSVar15->_vptr_ShaderExecutor[1])(pSVar15);
  pVVar20 = local_500;
  lVar16 = 0x10;
  do {
    *(undefined1 *)((long)&local_468 + lVar16) = 0;
    *(undefined8 *)((long)&local_460 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_458 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x40);
  lVar16 = 0x10;
  do {
    *(undefined1 *)((long)&local_468 + lVar16) = 0;
    *(undefined8 *)((long)&local_460 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_458 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 == 0x28);
  lVar16 = 0x10;
  do {
    local_1b8._M_local_buf[lVar16] = '\0';
    *(undefined8 *)(local_1a8 + lVar16 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x40);
  lVar16 = 0x10;
  do {
    local_1b8._M_local_buf[lVar16] = '\0';
    *(undefined8 *)(local_1a8 + lVar16 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 == 0x28);
  lVar16 = 0x10;
  do {
    auStack_4d0[lVar16] = 0;
    *(undefined8 *)((long)&uStack_4c8 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(&local_4c0._M_impl.field_0x0 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x40);
  lVar16 = 0x10;
  do {
    auStack_4d0[lVar16] = 0;
    *(undefined8 *)((long)&uStack_4c8 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(&local_4c0._M_impl.field_0x0 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 == 0x28);
  lVar16 = 0x10;
  do {
    *(undefined1 *)((long)&local_500 + lVar16) = 0;
    *(undefined8 *)((long)&local_4f8 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_4f0 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x40);
  lVar16 = 0x10;
  do {
    *(undefined1 *)((long)&local_500 + lVar16) = 0;
    *(undefined8 *)((long)&local_4f8 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_4f0 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 == 0x28);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_280,
             (local_500->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_458);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_280,
             (pVVar20->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_280,
             (pVVar20->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)&local_4c0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar20->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_2d8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_280,
             (pVVar20->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_4f0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar20->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_479);
  if (pVVar4 == local_4f8) {
    local_460 = (IVal *)0x0;
  }
  else {
    local_2b0 = &local_478->m_status;
    local_2b8 = (pointer)(local_470 + (local_470 == 0));
    local_4f8 = (pointer)0x0;
    local_460 = (IVal *)0x0;
    do {
      lVar16 = 0x10;
      do {
        local_1b8._M_local_buf[lVar16] = '\0';
        *(undefined8 *)(local_1a8 + lVar16 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar16) = 0xfff0000000000000;
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x40);
      lVar16 = 0x10;
      do {
        local_1b8._M_local_buf[lVar16] = '\0';
        *(undefined8 *)(local_1a8 + lVar16 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar16) = 0xfff0000000000000;
        lVar16 = lVar16 + 0x18;
      } while (lVar16 == 0x28);
      if (((ulong)local_4f8 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_478->super_TestCase).super_TestNode.m_testCtx);
      }
      local_4f0._0_8_ =
           *(undefined8 *)
            (local_490->in0).
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[(long)local_4f8].m_data;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)&local_4c0,local_488,(Vector<float,_2> *)local_4f0);
      pVVar20 = local_500;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_458,local_488,(IVal *)&local_4c0);
      pIVar17 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_280,
                           (pVVar20->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar17->m_data[1].m_lo = local_438;
      pIVar17->m_data[1].m_hi = (double)CONCAT44(DStack_430.basic.precision,DStack_430.basic.type);
      pIVar17->m_data[0].m_hi = (double)local_448._M_allocated_capacity;
      *(undefined8 *)(pIVar17->m_data + 1) = local_448._8_8_;
      pIVar17->m_data[0].m_hasNaN = local_458;
      pIVar17->m_data[0].m_lo = (double)pVStack_450;
      local_4f0._0_8_ =
           *(undefined8 *)
            (local_490->in1).
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[(long)local_4f8].m_data;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)&local_4c0,local_488,(Vector<float,_2> *)local_4f0);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_458,local_488,(IVal *)&local_4c0);
      pIVar17 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_280,
                           (pVVar20->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar17->m_data[1].m_lo = local_438;
      pIVar17->m_data[1].m_hi = (double)CONCAT44(DStack_430.basic.precision,DStack_430.basic.type);
      pIVar17->m_data[0].m_hi = (double)local_448._M_allocated_capacity;
      *(undefined8 *)(pIVar17->m_data + 1) = local_448._8_8_;
      pIVar17->m_data[0].m_hasNaN = local_458;
      pIVar17->m_data[0].m_lo = (double)pVStack_450;
      local_4f0._0_8_ =
           *(undefined8 *)
            (local_490->in2).
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[(long)local_4f8].m_data;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)&local_4c0,local_488,(Vector<float,_2> *)local_4f0);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_458,local_488,(IVal *)&local_4c0);
      pIVar17 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_280,
                           (pVVar20->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar17->m_data[1].m_lo = local_438;
      pIVar17->m_data[1].m_hi = (double)CONCAT44(DStack_430.basic.precision,DStack_430.basic.type);
      pIVar17->m_data[0].m_hi = (double)local_448._M_allocated_capacity;
      *(undefined8 *)(pIVar17->m_data + 1) = local_448._8_8_;
      pIVar17->m_data[0].m_hasNaN = local_458;
      pIVar17->m_data[0].m_lo = (double)pVStack_450;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar20->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      DStack_430.basic.type = (local_478->m_ctx).precision;
      local_438 = local_488->m_maxValue;
      local_458 = *(undefined1 (*) [8])local_488;
      pVStack_450 = *(pointer *)&local_488->m_fractionBits;
      local_448._M_allocated_capacity = *(undefined8 *)&local_488->m_hasInf;
      local_448._8_8_ = *(undefined8 *)&local_488->m_exactPrecision;
      local_420 = 0;
      DStack_430._8_8_ = &local_280;
      (*local_468->_vptr_Statement[3])(local_468,local_458);
      pIVar17 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_280,
                           (pVVar20->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_458,&local_2a8,pIVar17);
      pVVar3 = local_4f8;
      dStack_180 = (double)CONCAT44(DStack_430.basic.precision,DStack_430.basic.type);
      local_188 = local_438;
      local_1a8._16_8_ = local_448._M_allocated_capacity;
      local_1a8._24_8_ = local_448._8_8_;
      local_1a8._0_8_ = local_458;
      local_1a8._8_8_ = pVStack_450;
      bVar9 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                        ((IVal *)local_1a8,
                         local_250.out0.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)local_4f8);
      local_458 = (undefined1  [8])&local_448;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_458,"Shader output 0 is outside acceptable range","");
      bVar9 = tcu::ResultCollector::check(local_2b0,bVar9,(string *)local_458);
      if (local_458 != (undefined1  [8])&local_448) {
        operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
      }
      uVar18 = (int)local_460 + ((byte)~bVar9 & 1);
      pIVar17 = (IVal *)(ulong)uVar18;
      local_460 = pIVar17;
      if ((int)uVar18 < 0x65 && !bVar9) {
        local_458 = (undefined1  [8])((local_478->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_450);
        pcVar12 = "Failed";
        if (bVar9) {
          pcVar12 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,pcVar12,6);
        pp_Var2 = &local_4c0._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,"\t",1);
        pVVar5 = (local_500->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_4c0._M_impl._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4c0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_450,(char *)local_4c0._M_impl._0_8_,
                   CONCAT44(local_4c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                            local_4c0._M_impl.super__Rb_tree_header._M_header._M_color));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_4f0,(BuiltinPrecisionTests *)&local_2a8,
                   (FloatFormat *)
                   ((local_490->in0).
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar3),
                   (Vector<float,_2> *)pIVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_450,(char *)local_4f0._0_8_,local_4f0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,"\n",1);
        if (local_4f0._0_8_ != (long)local_4f0 + 0x10) {
          operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
        }
        if ((_Base_ptr *)local_4c0._M_impl._0_8_ != pp_Var2) {
          operator_delete((void *)local_4c0._M_impl._0_8_,
                          (ulong)((long)&(local_4c0._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,"\t",1);
        pVVar5 = (local_500->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_4c0._M_impl._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4c0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_450,(char *)local_4c0._M_impl._0_8_,
                   CONCAT44(local_4c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                            local_4c0._M_impl.super__Rb_tree_header._M_header._M_color));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_4f0,(BuiltinPrecisionTests *)&local_2a8,
                   (FloatFormat *)
                   ((local_490->in1).
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar3),
                   (Vector<float,_2> *)pIVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_450,(char *)local_4f0._0_8_,local_4f0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,"\n",1);
        if (local_4f0._0_8_ != (long)local_4f0 + 0x10) {
          operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
        }
        if ((_Base_ptr *)local_4c0._M_impl._0_8_ != pp_Var2) {
          operator_delete((void *)local_4c0._M_impl._0_8_,
                          (ulong)((long)&(local_4c0._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,"\t",1);
        pVVar5 = (local_500->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_4c0._M_impl._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4c0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_450,(char *)local_4c0._M_impl._0_8_,
                   CONCAT44(local_4c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                            local_4c0._M_impl.super__Rb_tree_header._M_header._M_color));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_4f0,(BuiltinPrecisionTests *)&local_2a8,
                   (FloatFormat *)
                   ((local_490->in2).
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar3),
                   (Vector<float,_2> *)pIVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_450,(char *)local_4f0._0_8_,local_4f0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,"\n",1);
        if (local_4f0._0_8_ != (long)local_4f0 + 0x10) {
          operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
        }
        if ((_Base_ptr *)local_4c0._M_impl._0_8_ != pp_Var2) {
          operator_delete((void *)local_4c0._M_impl._0_8_,
                          (ulong)((long)&(local_4c0._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,"\t",1);
        pVVar5 = (local_500->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_4c0._M_impl._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4c0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_450,(char *)local_4c0._M_impl._0_8_,
                   CONCAT44(local_4c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                            local_4c0._M_impl.super__Rb_tree_header._M_header._M_color));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_4f0,(BuiltinPrecisionTests *)&local_2a8,
                   (FloatFormat *)
                   (local_250.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar3),
                   (Vector<float,_2> *)pIVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_450,(char *)local_4f0._0_8_,local_4f0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_450,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,2>>
                  (&local_2d8,(BuiltinPrecisionTests *)&local_2a8,(FloatFormat *)local_1a8,pIVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_450,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        if (local_4f0._0_8_ != (long)local_4f0 + 0x10) {
          operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
        }
        if ((_Base_ptr *)local_4c0._M_impl._0_8_ != pp_Var2) {
          operator_delete((void *)local_4c0._M_impl._0_8_,
                          (ulong)((long)&(local_4c0._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_450);
        std::ios_base::~ios_base(local_3e0);
      }
      local_4f8 = (pointer)((long)local_4f8->m_data + 1);
    } while (local_4f8 != local_2b8);
  }
  pPVar7 = local_478;
  iVar10 = (int)local_460;
  if (100 < iVar10) {
    local_458 = (undefined1  [8])((local_478->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_450);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,"(Skipped ",9);
    std::ostream::operator<<((ostringstream *)&pVStack_450,iVar10 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_450);
    std::ios_base::~ios_base(local_3e0);
  }
  if (iVar10 == 0) {
    local_458 = (undefined1  [8])((pPVar7->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_450);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_450," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_458 = (undefined1  [8])((pPVar7->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_450);
    std::ostream::operator<<((ostringstream *)&pVStack_450,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_450,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_450," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_450);
  std::ios_base::~ios_base(local_3e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_250.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.out0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}